

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetIF.hpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* gmlc::netif::getInterfaceAddresses_abi_cxx11_(int family)

{
  bool bVar1;
  int iVar2;
  IF_ADDRS_UNICAST addrs_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  string ipAddr;
  IF_ADDRS a;
  IF_ADDRS addrs;
  IF_ADDRS allAddrs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *result_list;
  IF_ADDRS *in_stack_ffffffffffffff78;
  IF_ADDRS_UNICAST in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar3;
  undefined8 local_38;
  int in_stack_ffffffffffffffe4;
  IF_ADDRS_UNICAST addr;
  
  pvVar3 = in_RDI;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x70fb6a);
  local_38 = (IF_ADDRS_UNICAST)0x0;
  getAddresses((int)((ulong)in_stack_ffffffffffffff80 >> 0x20),in_stack_ffffffffffffff78);
  addr = local_38;
  while (local_38 != (IF_ADDRS_UNICAST)0x0) {
    addrs_00 = (IF_ADDRS_UNICAST)getSockAddr(local_38);
    iVar2 = getSockAddrLen(local_38);
    addressToString_abi_cxx11_((sockaddr *)addr,in_stack_ffffffffffffffe4);
    bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x70fbe3);
    if (!bVar1) {
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)addrs_00,(value_type *)CONCAT44(iVar2,in_stack_ffffffffffffff88));
    }
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffff80);
    in_stack_ffffffffffffff80 = getNextAddress((int)((ulong)pvVar3 >> 0x20),addrs_00);
    local_38 = in_stack_ffffffffffffff80;
  }
  if (addr != (IF_ADDRS_UNICAST)0x0) {
    freeAddresses((IF_ADDRS)0x70fc67);
  }
  return in_RDI;
}

Assistant:

std::vector<std::string> getInterfaceAddresses(int family)
    {
        std::vector<std::string> result_list;

        IF_ADDRS allAddrs = NULL;

        getAddresses(family, &allAddrs);

#if defined(_WIN32) || defined(__USE_W32_SOCKETS)
        WSADATA wsaData;
        if (WSAStartup(0x202, &wsaData) != 0) {
            return result_list;
        }
        auto winAddrs = allAddrs;
        while (winAddrs) {
            auto addrs = winAddrs->FirstUnicastAddress;
#else
        auto addrs = allAddrs;
#endif

            for (auto a = addrs; a != NULL; a = getNextAddress(family, a)) {
                std::string ipAddr = addressToString(getSockAddr(a), getSockAddrLen(a));
                if (!ipAddr.empty()) {
                    result_list.push_back(ipAddr);
                }
            }

#if defined(_WIN32) || defined(__USE_W32_SOCKETS)
            winAddrs = winAddrs->Next;
        }
        WSACleanup();
#endif

        if (allAddrs) {
            freeAddresses(allAddrs);
        }
        return result_list;
    }